

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  undefined1 *from;
  Result *_result;
  allocator<char> local_b9;
  string local_b8;
  Pooling3DLayerParams pooling3d;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Pooling3d",(allocator<char> *)&pooling3d);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_48);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pooling3d,"Pooling3d",(allocator<char> *)&local_b8);
        validateRankCount(__return_storage_ptr__,layer,(string *)&pooling3d,5,-1,
                          &this->blobNameToRank);
        std::__cxx11::string::~string((string *)&pooling3d);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      if (layer->_oneof_case_[0] == 0x5b9) {
        from = *(undefined1 **)&layer->layer_;
      }
      else {
        from = Specification::_Pooling3DLayerParams_default_instance_;
      }
      Specification::Pooling3DLayerParams::Pooling3DLayerParams
                (&pooling3d,(Pooling3DLayerParams *)from);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Kernel Depth",&local_b9);
      validatePositive(__return_storage_ptr__,pooling3d.kerneldepth_,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      bVar1 = Result::good(__return_storage_ptr__);
      if (bVar1) {
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Kernel Height",&local_b9);
        validatePositive(__return_storage_ptr__,pooling3d.kernelheight_,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        bVar1 = Result::good(__return_storage_ptr__);
        if (bVar1) {
          std::__cxx11::string::~string((string *)this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Kernel Width",&local_b9);
          validatePositive(__return_storage_ptr__,pooling3d.kernelwidth_,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          bVar1 = Result::good(__return_storage_ptr__);
          if (bVar1) {
            std::__cxx11::string::~string((string *)this_00);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b8,"Stride Depth",&local_b9);
            validatePositive(__return_storage_ptr__,pooling3d.stridedepth_,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            bVar1 = Result::good(__return_storage_ptr__);
            if (bVar1) {
              std::__cxx11::string::~string((string *)this_00);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,"Stride Height",&local_b9);
              validatePositive(__return_storage_ptr__,pooling3d.strideheight_,&local_b8);
              std::__cxx11::string::~string((string *)&local_b8);
              bVar1 = Result::good(__return_storage_ptr__);
              if (bVar1) {
                std::__cxx11::string::~string((string *)this_00);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b8,"Stride Width",&local_b9);
                validatePositive(__return_storage_ptr__,pooling3d.stridewidth_,&local_b8);
                std::__cxx11::string::~string((string *)&local_b8);
                bVar1 = Result::good(__return_storage_ptr__);
                if (bVar1) {
                  std::__cxx11::string::~string((string *)this_00);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_b8,"Front",&local_b9);
                  validatePooling3dPadding
                            (__return_storage_ptr__,pooling3d.paddingtype_,
                             pooling3d.custompaddingfront_,&local_b8);
                  std::__cxx11::string::~string((string *)&local_b8);
                  bVar1 = Result::good(__return_storage_ptr__);
                  if (bVar1) {
                    std::__cxx11::string::~string((string *)this_00);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_b8,"Back",&local_b9);
                    validatePooling3dPadding
                              (__return_storage_ptr__,pooling3d.paddingtype_,
                               pooling3d.custompaddingback_,&local_b8);
                    std::__cxx11::string::~string((string *)&local_b8);
                    bVar1 = Result::good(__return_storage_ptr__);
                    if (bVar1) {
                      std::__cxx11::string::~string((string *)this_00);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_b8,"Top",&local_b9);
                      validatePooling3dPadding
                                (__return_storage_ptr__,pooling3d.paddingtype_,
                                 pooling3d.custompaddingtop_,&local_b8);
                      std::__cxx11::string::~string((string *)&local_b8);
                      bVar1 = Result::good(__return_storage_ptr__);
                      if (bVar1) {
                        std::__cxx11::string::~string((string *)this_00);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_b8,"Bottom",&local_b9);
                        validatePooling3dPadding
                                  (__return_storage_ptr__,pooling3d.paddingtype_,
                                   pooling3d.custompaddingbottom_,&local_b8);
                        std::__cxx11::string::~string((string *)&local_b8);
                        bVar1 = Result::good(__return_storage_ptr__);
                        if (bVar1) {
                          std::__cxx11::string::~string((string *)this_00);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_b8,"Left",&local_b9);
                          validatePooling3dPadding
                                    (__return_storage_ptr__,pooling3d.paddingtype_,
                                     pooling3d.custompaddingleft_,&local_b8);
                          std::__cxx11::string::~string((string *)&local_b8);
                          bVar1 = Result::good(__return_storage_ptr__);
                          if (bVar1) {
                            std::__cxx11::string::~string((string *)this_00);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_b8,"Right",&local_b9);
                            validatePooling3dPadding
                                      (__return_storage_ptr__,pooling3d.paddingtype_,
                                       pooling3d.custompaddingright_,&local_b8);
                            std::__cxx11::string::~string((string *)&local_b8);
                            bVar1 = Result::good(__return_storage_ptr__);
                            if (bVar1) {
                              std::__cxx11::string::~string((string *)this_00);
                              Result::Result(__return_storage_ptr__);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Specification::Pooling3DLayerParams::~Pooling3DLayerParams(&pooling3d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1))

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank));

        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank));
    }

    // Kernel
    const auto pooling3d = layer.pooling3d();

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kerneldepth(), "Kernel Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelheight(), "Kernel Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.kernelwidth(), "Kernel Width"));

    // Stride
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridedepth(), "Stride Depth"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.strideheight(), "Stride Height"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePositive(pooling3d.stridewidth(), "Stride Width"));

    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right"));

    return Result();
}